

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__horizontal_gather_1_channels_with_7_coeffs
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  __m128 c;
  __m128 tot;
  float *hc;
  float *decode;
  __m128 mask;
  float *local_190;
  float *output;
  float *output_end;
  float *pfStack_178;
  int coefficient_width_local;
  float *horizontal_coefficients_local;
  stbir__contributors *horizontal_contributors_local;
  float *decode_buffer_local;
  uint output_sub_size_local;
  float *output_buffer_local;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  
  local_190 = output_buffer;
  pfStack_178 = horizontal_coefficients;
  horizontal_coefficients_local = (float *)horizontal_contributors;
  do {
    pfVar1 = decode_buffer + (int)*horizontal_coefficients_local;
    local_98 = (float)*(undefined8 *)pfStack_178;
    fStack_94 = (float)((ulong)*(undefined8 *)pfStack_178 >> 0x20);
    fStack_90 = (float)*(undefined8 *)(pfStack_178 + 2);
    fStack_8c = (float)((ulong)*(undefined8 *)(pfStack_178 + 2) >> 0x20);
    local_a8 = (float)*(undefined8 *)pfVar1;
    fStack_a4 = (float)((ulong)*(undefined8 *)pfVar1 >> 0x20);
    fStack_a0 = (float)*(undefined8 *)(pfVar1 + 2);
    fStack_9c = (float)((ulong)*(undefined8 *)(pfVar1 + 2) >> 0x20);
    local_b8 = (float)*(undefined8 *)(pfStack_178 + 4);
    fStack_b4 = (float)((ulong)*(undefined8 *)(pfStack_178 + 4) >> 0x20);
    fStack_b0 = (float)*(undefined8 *)(pfStack_178 + 6);
    local_c8 = (float)*(undefined8 *)(pfVar1 + 4);
    fStack_c4 = (float)((ulong)*(undefined8 *)(pfVar1 + 4) >> 0x20);
    fStack_c0 = (float)*(undefined8 *)(pfVar1 + 6);
    fStack_bc = (float)((ulong)*(undefined8 *)(pfVar1 + 6) >> 0x20);
    *local_190 = local_98 * local_a8 + local_b8 * local_c8 +
                 fStack_90 * fStack_a0 + fStack_b0 * fStack_c0 +
                 fStack_94 * fStack_a4 + fStack_b4 * fStack_c4 +
                 fStack_8c * fStack_9c + fStack_bc * 0.0;
    pfStack_178 = pfStack_178 + coefficient_width;
    horizontal_coefficients_local = horizontal_coefficients_local + 2;
    local_190 = local_190 + 1;
  } while (local_190 < output_buffer + output_sub_size);
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_7_coeffs)( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  stbir__3_coeff_setup();
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    float const * hc = horizontal_coefficients;

    stbir__4_coeff_start();
    stbir__3_coeff_remnant(4);
    stbir__store_output();
  } while ( output < output_end );
}